

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

int http_snprintf(nng_http *conn,char *buf,size_t sz)

{
  nng_http_req *pnVar1;
  int iVar2;
  nng_http_status nVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  nni_list *local_38;
  nni_list *hdrs;
  size_t n;
  size_t len;
  size_t sz_local;
  char *buf_local;
  nng_http *conn_local;
  
  if ((conn->client & 1U) == 0) {
    pcVar5 = nni_http_get_version(conn);
    nVar3 = nni_http_get_status(conn);
    pcVar6 = nni_http_get_reason(conn);
    iVar2 = snprintf(buf,sz,"%s %d %s\r\n",pcVar5,(ulong)nVar3,pcVar6);
    pnVar1 = (nng_http_req *)&conn->res;
  }
  else {
    pcVar5 = nni_http_get_method(conn);
    pcVar6 = nni_http_get_uri(conn);
    pcVar7 = nni_http_get_version(conn);
    iVar2 = snprintf(buf,sz,"%s %s %s\r\n",pcVar5,pcVar6,pcVar7);
    pnVar1 = &conn->req;
  }
  local_38 = &(pnVar1->data).hdrs;
  n = (size_t)iVar2;
  if (n < sz) {
    len = sz - n;
    sz_local = (size_t)(buf + n);
  }
  else {
    len = 0;
    sz_local = 0;
  }
  sVar8 = http_sprintf_headers((char *)sz_local,len,local_38);
  if (sVar8 < len) {
    len = len - sVar8;
    sz_local = sVar8 + sz_local;
  }
  else {
    len = 0;
    sz_local = 0;
  }
  iVar4 = snprintf((char *)sz_local,len,"\r\n");
  return iVar4 + (int)sVar8 + iVar2;
}

Assistant:

static int
http_snprintf(nng_http *conn, char *buf, size_t sz)
{
	size_t    len;
	size_t    n;
	nni_list *hdrs;

	if (conn->client) {
		len  = snprintf(buf, sz, "%s %s %s\r\n",
		     nni_http_get_method(conn), nni_http_get_uri(conn),
		     nni_http_get_version(conn));
		hdrs = &conn->req.data.hdrs;
	} else {
		len  = snprintf(buf, sz, "%s %d %s\r\n",
		     nni_http_get_version(conn), nni_http_get_status(conn),
		     nni_http_get_reason(conn));
		hdrs = &conn->res.data.hdrs;
	}

	if (len < sz) {
		sz -= len;
		buf += len;
	} else {
		sz  = 0;
		buf = NULL;
	}

	n = http_sprintf_headers(buf, sz, hdrs);
	len += n;
	if (n < sz) {
		sz -= n;
		buf += n;
	} else {
		sz  = 0;
		buf = NULL;
	}

	len += snprintf(buf, sz, "\r\n");
	return (len);
}